

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O2

void VP8LDoFillBitWindow(VP8LBitReader *br)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  sVar1 = br->pos;
  if (sVar1 + 8 < br->len) {
    uVar2 = br->val;
    br->val = uVar2 >> 0x20;
    br->bit_pos = br->bit_pos + -0x20;
    br->val = (ulong)*(uint *)(br->buf + sVar1) << 0x20 | uVar2 >> 0x20;
    br->pos = sVar1 + 4;
    return;
  }
  iVar4 = br->bit_pos;
  while ((7 < iVar4 && (uVar2 = br->pos, uVar2 < br->len))) {
    uVar3 = br->val;
    br->val = uVar3 >> 8;
    br->val = (ulong)br->buf[uVar2] << 0x38 | uVar3 >> 8;
    br->pos = uVar2 + 1;
    iVar4 = iVar4 + -8;
    br->bit_pos = iVar4;
  }
  iVar4 = VP8LIsEndOfStream(br);
  if (iVar4 != 0) {
    br->bit_pos = 0;
    br->eos = 1;
  }
  return;
}

Assistant:

void VP8LDoFillBitWindow(VP8LBitReader* const br) {
  assert(br->bit_pos >= VP8L_WBITS);
#if defined(VP8L_USE_FAST_LOAD)
  if (br->pos + sizeof(br->val) < br->len) {
    br->val >>= VP8L_WBITS;
    br->bit_pos -= VP8L_WBITS;
    br->val |= (vp8l_val_t)HToLE32(WebPMemToUint32(br->buf + br->pos)) <<
               (VP8L_LBITS - VP8L_WBITS);
    br->pos += VP8L_LOG8_WBITS;
    return;
  }
#endif
  ShiftBytes(br);       // Slow path.
}